

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HModel.cpp
# Opt level: O3

double __thiscall HModel::computePrObj(HModel *this)

{
  int iVar1;
  uint uVar2;
  ulong uVar3;
  long lVar4;
  double dVar5;
  
  if ((long)this->numRow < 1) {
    uVar2 = this->numCol;
    dVar5 = 0.0;
  }
  else {
    uVar2 = this->numCol;
    dVar5 = 0.0;
    lVar4 = 0;
    do {
      iVar1 = (this->basicIndex).super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start[lVar4];
      if (iVar1 < (int)uVar2) {
        dVar5 = dVar5 + (this->baseValue).super__Vector_base<double,_std::allocator<double>_>.
                        _M_impl.super__Vector_impl_data._M_start[lVar4] *
                        (this->colCost).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start[iVar1];
      }
      lVar4 = lVar4 + 1;
    } while (this->numRow != lVar4);
  }
  if (0 < (int)uVar2) {
    uVar3 = 0;
    do {
      if ((this->nonbasicFlag).super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_start[uVar3] != 0) {
        dVar5 = dVar5 + (this->workValue).super__Vector_base<double,_std::allocator<double>_>.
                        _M_impl.super__Vector_impl_data._M_start[uVar3] *
                        (this->colCost).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start[uVar3];
      }
      uVar3 = uVar3 + 1;
    } while (uVar2 != uVar3);
  }
  return dVar5;
}

Assistant:

double HModel::computePrObj() {
    double prObj = 0;
    for (int row = 0; row < numRow; row++) {
      int var = basicIndex[row];
      if (var < numCol) prObj += baseValue[row]*colCost[var];
    }
    for (int col = 0; col < numCol; col++)
        if (nonbasicFlag[col]) prObj += workValue[col]*colCost[col];
    return prObj;
}